

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_transpose16x16_avx2(__m256i *x,__m256i *d)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  long lVar7;
  long in_RSI;
  undefined1 (*in_RDI) [32];
  undefined1 auVar8 [32];
  int i;
  __m256i dd [16];
  __m256i ww1;
  __m256i ww0;
  __m256i w3;
  __m256i w2;
  __m256i w1;
  __m256i w0;
  int local_f44;
  undefined1 local_f40 [32];
  undefined1 local_f20 [32];
  undefined1 local_f00 [32];
  undefined1 local_ee0 [32];
  undefined1 local_ec0 [32];
  undefined1 local_ea0 [32];
  undefined1 local_e80 [32];
  undefined1 local_e60 [32];
  undefined1 local_e40 [32];
  undefined1 local_e20 [32];
  undefined1 local_e00 [32];
  undefined1 local_de0 [32];
  undefined1 local_dc0 [32];
  undefined1 local_da0 [32];
  undefined1 local_d80 [32];
  undefined1 local_d60 [32];
  undefined1 local_d40 [32];
  
  auVar8 = vpunpcklwd_avx2(*in_RDI,in_RDI[1]);
  auVar1 = vpunpcklwd_avx2(in_RDI[2],in_RDI[3]);
  auVar2 = vpunpcklwd_avx2(in_RDI[4],in_RDI[5]);
  auVar3 = vpunpcklwd_avx2(in_RDI[6],in_RDI[7]);
  auVar4 = vpunpckldq_avx2(auVar8,auVar1);
  auVar5 = vpunpckldq_avx2(auVar2,auVar3);
  local_f40 = vpunpcklqdq_avx2(auVar4,auVar5);
  local_f20 = vpunpckhqdq_avx2(auVar4,auVar5);
  auVar8 = vpunpckhdq_avx2(auVar8,auVar1);
  auVar1 = vpunpckhdq_avx2(auVar2,auVar3);
  local_f00 = vpunpcklqdq_avx2(auVar8,auVar1);
  local_ee0 = vpunpckhqdq_avx2(auVar8,auVar1);
  auVar8 = vpunpckhwd_avx2(*in_RDI,in_RDI[1]);
  auVar1 = vpunpckhwd_avx2(in_RDI[2],in_RDI[3]);
  auVar2 = vpunpckhwd_avx2(in_RDI[4],in_RDI[5]);
  auVar3 = vpunpckhwd_avx2(in_RDI[6],in_RDI[7]);
  auVar4 = vpunpckldq_avx2(auVar8,auVar1);
  auVar5 = vpunpckldq_avx2(auVar2,auVar3);
  local_ec0 = vpunpcklqdq_avx2(auVar4,auVar5);
  local_ea0 = vpunpckhqdq_avx2(auVar4,auVar5);
  auVar8 = vpunpckhdq_avx2(auVar8,auVar1);
  auVar1 = vpunpckhdq_avx2(auVar2,auVar3);
  local_e80 = vpunpcklqdq_avx2(auVar8,auVar1);
  local_e60 = vpunpckhqdq_avx2(auVar8,auVar1);
  auVar8 = vpunpcklwd_avx2(in_RDI[8],in_RDI[9]);
  auVar1 = vpunpcklwd_avx2(in_RDI[10],in_RDI[0xb]);
  auVar2 = vpunpcklwd_avx2(in_RDI[0xc],in_RDI[0xd]);
  auVar3 = vpunpcklwd_avx2(in_RDI[0xe],in_RDI[0xf]);
  auVar4 = vpunpckldq_avx2(auVar8,auVar1);
  auVar5 = vpunpckldq_avx2(auVar2,auVar3);
  local_e40 = vpunpcklqdq_avx2(auVar4,auVar5);
  local_e20 = vpunpckhqdq_avx2(auVar4,auVar5);
  auVar8 = vpunpckhdq_avx2(auVar8,auVar1);
  auVar1 = vpunpckhdq_avx2(auVar2,auVar3);
  local_e00 = vpunpcklqdq_avx2(auVar8,auVar1);
  local_de0 = vpunpckhqdq_avx2(auVar8,auVar1);
  auVar8 = vpunpckhwd_avx2(in_RDI[8],in_RDI[9]);
  auVar1 = vpunpckhwd_avx2(in_RDI[10],in_RDI[0xb]);
  auVar2 = vpunpckhwd_avx2(in_RDI[0xc],in_RDI[0xd]);
  auVar3 = vpunpckhwd_avx2(in_RDI[0xe],in_RDI[0xf]);
  auVar4 = vpunpckldq_avx2(auVar8,auVar1);
  auVar5 = vpunpckldq_avx2(auVar2,auVar3);
  local_dc0 = vpunpcklqdq_avx2(auVar4,auVar5);
  local_da0 = vpunpckhqdq_avx2(auVar4,auVar5);
  auVar8 = vpunpckhdq_avx2(auVar8,auVar1);
  local_d40 = vpunpckhdq_avx2(auVar2,auVar3);
  local_d80 = vpunpcklqdq_avx2(auVar8,local_d40);
  local_d60 = vpunpckhqdq_avx2(auVar8,local_d40);
  for (local_f44 = 0; local_f44 < 8; local_f44 = local_f44 + 1) {
    lVar7 = (long)local_f44 * 0x20;
    auVar6._8_8_ = *(undefined8 *)(local_e40 + lVar7 + 8);
    auVar6._0_8_ = *(undefined8 *)(local_e40 + lVar7);
    auVar8._0_16_ =
         ZEXT116(0) * auVar6 + ZEXT116(1) * SUB3216(*(undefined1 (*) [32])(local_f40 + lVar7),0);
    auVar8._16_16_ =
         ZEXT116(0) * SUB3216(*(undefined1 (*) [32])(local_f40 + lVar7),0x10) + ZEXT116(1) * auVar6;
    *(undefined1 (*) [32])(in_RSI + (long)local_f44 * 0x20) = auVar8;
    auVar8 = vblendps_avx(*(undefined1 (*) [32])(local_e40 + (long)local_f44 * 0x20),
                          ZEXT1632(*(undefined1 (*) [16])(local_f40 + (long)local_f44 * 0x20 + 0x10)
                                  ),0xf);
    *(undefined1 (*) [32])(in_RSI + (long)(local_f44 + 8) * 0x20) = auVar8;
  }
  return;
}

Assistant:

static inline void highbd_transpose16x16_avx2(__m256i *x, __m256i *d) {
  __m256i w0, w1, w2, w3, ww0, ww1;
  __m256i dd[16];
  w0 = _mm256_unpacklo_epi16(x[0], x[1]);
  w1 = _mm256_unpacklo_epi16(x[2], x[3]);
  w2 = _mm256_unpacklo_epi16(x[4], x[5]);
  w3 = _mm256_unpacklo_epi16(x[6], x[7]);

  ww0 = _mm256_unpacklo_epi32(w0, w1);  //
  ww1 = _mm256_unpacklo_epi32(w2, w3);  //

  dd[0] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[1] = _mm256_unpackhi_epi64(ww0, ww1);

  ww0 = _mm256_unpackhi_epi32(w0, w1);  //
  ww1 = _mm256_unpackhi_epi32(w2, w3);  //

  dd[2] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[3] = _mm256_unpackhi_epi64(ww0, ww1);

  w0 = _mm256_unpackhi_epi16(x[0], x[1]);
  w1 = _mm256_unpackhi_epi16(x[2], x[3]);
  w2 = _mm256_unpackhi_epi16(x[4], x[5]);
  w3 = _mm256_unpackhi_epi16(x[6], x[7]);

  ww0 = _mm256_unpacklo_epi32(w0, w1);  //
  ww1 = _mm256_unpacklo_epi32(w2, w3);  //

  dd[4] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[5] = _mm256_unpackhi_epi64(ww0, ww1);

  ww0 = _mm256_unpackhi_epi32(w0, w1);  //
  ww1 = _mm256_unpackhi_epi32(w2, w3);  //

  dd[6] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[7] = _mm256_unpackhi_epi64(ww0, ww1);

  w0 = _mm256_unpacklo_epi16(x[8], x[9]);
  w1 = _mm256_unpacklo_epi16(x[10], x[11]);
  w2 = _mm256_unpacklo_epi16(x[12], x[13]);
  w3 = _mm256_unpacklo_epi16(x[14], x[15]);

  ww0 = _mm256_unpacklo_epi32(w0, w1);
  ww1 = _mm256_unpacklo_epi32(w2, w3);

  dd[8] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[9] = _mm256_unpackhi_epi64(ww0, ww1);

  ww0 = _mm256_unpackhi_epi32(w0, w1);
  ww1 = _mm256_unpackhi_epi32(w2, w3);

  dd[10] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[11] = _mm256_unpackhi_epi64(ww0, ww1);

  w0 = _mm256_unpackhi_epi16(x[8], x[9]);
  w1 = _mm256_unpackhi_epi16(x[10], x[11]);
  w2 = _mm256_unpackhi_epi16(x[12], x[13]);
  w3 = _mm256_unpackhi_epi16(x[14], x[15]);

  ww0 = _mm256_unpacklo_epi32(w0, w1);
  ww1 = _mm256_unpacklo_epi32(w2, w3);

  dd[12] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[13] = _mm256_unpackhi_epi64(ww0, ww1);

  ww0 = _mm256_unpackhi_epi32(w0, w1);
  ww1 = _mm256_unpackhi_epi32(w2, w3);

  dd[14] = _mm256_unpacklo_epi64(ww0, ww1);
  dd[15] = _mm256_unpackhi_epi64(ww0, ww1);

  for (int i = 0; i < 8; i++) {
    d[i] = _mm256_insertf128_si256(dd[i], _mm256_castsi256_si128(dd[i + 8]), 1);
    d[i + 8] = _mm256_insertf128_si256(dd[i + 8],
                                       _mm256_extracti128_si256(dd[i], 1), 0);
  }
}